

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkDarTempor(Abc_Ntk_t *pNtk,int nFrames,int TimeOut,int nConfLimit,int fUseBmc,
                int fUseTransSigs,int fVerbose,int fVeryVerbose)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fUseTransSigs_local;
  int fUseBmc_local;
  int nConfLimit_local;
  int TimeOut_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_00 = Saig_ManTempor(pAig,nFrames,TimeOut,nConfLimit,fUseBmc,fUseTransSigs,fVerbose,
                             fVeryVerbose);
    Aig_ManStop(pAig);
    if (pMan_00 == (Aig_Man_t *)0x0) {
      pNtk_local = Abc_NtkDup(pNtk);
    }
    else {
      pNtk_local = Abc_NtkFromDarSeqSweep(pNtk,pMan_00);
      Aig_ManStop(pMan_00);
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarTempor( Abc_Ntk_t * pNtk, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose )
{
    extern Aig_Man_t * Saig_ManTempor( Aig_Man_t * pAig, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    pTemp = Saig_ManTempor( pMan, nFrames, TimeOut, nConfLimit, fUseBmc, fUseTransSigs, fVerbose, fVeryVerbose );
    Aig_ManStop( pMan );
    if ( pTemp == NULL )
        return Abc_NtkDup( pNtk );
    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pTemp );
    Aig_ManStop( pTemp );
    return pNtkAig;
}